

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O1

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doitfirst<frozen::basic_string<char>const*,128ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  char cVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  basic_string<char> *pbVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  plVar2 = *(long **)this;
  uVar3 = *(ulong *)(first + 0x3f8);
  uVar4 = plVar2[1];
  uVar7 = uVar4;
  if (uVar3 < uVar4) {
    uVar7 = uVar3;
  }
  if (uVar7 != 0) {
    uVar6 = 0;
    uVar9 = 1;
    do {
      cVar1 = *(char *)(*(long *)(first + 0x3f0) + uVar6);
      if (cVar1 != *(char *)(*plVar2 + uVar6)) {
        bVar10 = cVar1 < *(char *)(*plVar2 + uVar6);
        goto LAB_00188d17;
      }
      bVar10 = uVar9 < uVar7;
      uVar6 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar10);
  }
  bVar10 = uVar3 < uVar4;
LAB_00188d17:
  if (bVar10) {
    uVar3 = *(ulong *)(first + 0x5f8);
    uVar7 = uVar4;
    if (uVar3 < uVar4) {
      uVar7 = uVar3;
    }
    if (uVar7 != 0) {
      uVar8 = 1;
      uVar6 = 0;
      do {
        cVar1 = *(char *)(*(long *)(first + 0x5f0) + uVar6);
        if (cVar1 != *(char *)(*plVar2 + uVar6)) {
          bVar10 = cVar1 < *(char *)(*plVar2 + uVar6);
          goto LAB_00188daa;
        }
        uVar6 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar6 < uVar7);
    }
    bVar10 = uVar3 < uVar4;
LAB_00188daa:
    if (bVar10) {
      pbVar5 = doitfirst<frozen::basic_string<char>const*,32ul>(this,first + 0x600);
      return pbVar5;
    }
    first = first + 0x400;
  }
  else {
    uVar3 = *(ulong *)(first + 0x1f8);
    uVar7 = uVar4;
    if (uVar3 < uVar4) {
      uVar7 = uVar3;
    }
    if (uVar7 != 0) {
      uVar8 = 1;
      uVar6 = 0;
      do {
        cVar1 = *(char *)(*(long *)(first + 0x1f0) + uVar6);
        if (cVar1 != *(char *)(*plVar2 + uVar6)) {
          bVar10 = cVar1 < *(char *)(*plVar2 + uVar6);
          goto LAB_00188dc8;
        }
        uVar6 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar6 < uVar7);
    }
    bVar10 = uVar3 < uVar4;
LAB_00188dc8:
    first = first + (ulong)bVar10 * 0x200;
  }
  pbVar5 = doit_fast<frozen::basic_string<char>const*,31ul>(this,first);
  return pbVar5;
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }